

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subst.c
# Opt level: O0

void realloc_strncat(char **str,char *append,size_t len)

{
  char *__dest;
  int *piVar1;
  size_t local_30;
  size_t old_len;
  char *new_str;
  size_t len_local;
  char *append_local;
  char **str_local;
  
  if (*str == (char *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = strlen(*str);
  }
  __dest = (char *)malloc(local_30 + len + 1);
  if (__dest == (char *)0x0) {
    piVar1 = __errno_location();
    lafe_errc(1,*piVar1,"Out of memory");
  }
  if (*str != (char *)0x0) {
    memcpy(__dest,*str,local_30);
  }
  memcpy(__dest + local_30,append,len);
  __dest[local_30 + len] = '\0';
  free(*str);
  *str = __dest;
  return;
}

Assistant:

static void
realloc_strncat(char **str, const char *append, size_t len)
{
	char *new_str;
	size_t old_len;

	if (*str == NULL)
		old_len = 0;
	else
		old_len = strlen(*str);

	new_str = malloc(old_len + len + 1);
	if (new_str == NULL)
		lafe_errc(1, errno, "Out of memory");
	if (*str != NULL)
		memcpy(new_str, *str, old_len);
	memcpy(new_str + old_len, append, len);
	new_str[old_len + len] = '\0';
	free(*str);
	*str = new_str;
}